

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

LY_ERR lyxml_next_attr_content
                 (lyxml_ctx *xmlctx,char **value,size_t *value_len,ly_bool *ws_only,ly_bool *dynamic
                 )

{
  char endchar;
  ly_ctx *plVar1;
  uint uVar2;
  bool bVar3;
  LY_ERR ret__;
  char quot;
  ly_bool *dynamic_local;
  ly_bool *ws_only_local;
  size_t *value_len_local;
  char **value_local;
  lyxml_ctx *xmlctx_local;
  
  while( true ) {
    bVar3 = true;
    if (((*xmlctx->in->current != ' ') && (bVar3 = true, *xmlctx->in->current != '\t')) &&
       (bVar3 = true, *xmlctx->in->current != '\n')) {
      bVar3 = *xmlctx->in->current == '\r';
    }
    if (!bVar3) break;
    if (*xmlctx->in->current == '\n') {
      xmlctx->in->line = xmlctx->in->line + 1;
    }
    ly_in_skip(xmlctx->in,1);
  }
  if (*xmlctx->in->current == '\0') {
    ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,"Unexpected end-of-input.");
    xmlctx_local._4_4_ = LY_EVALID;
  }
  else if (*xmlctx->in->current == '=') {
    ly_in_skip(xmlctx->in,1);
    if (*xmlctx->in->current == '\0') {
      ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,"Unexpected end-of-input.");
      xmlctx_local._4_4_ = LY_EVALID;
    }
    else {
      while( true ) {
        bVar3 = true;
        if (((*xmlctx->in->current != ' ') && (bVar3 = true, *xmlctx->in->current != '\t')) &&
           (bVar3 = true, *xmlctx->in->current != '\n')) {
          bVar3 = *xmlctx->in->current == '\r';
        }
        if (!bVar3) break;
        if (*xmlctx->in->current == '\n') {
          xmlctx->in->line = xmlctx->in->line + 1;
        }
        ly_in_skip(xmlctx->in,1);
      }
      if (*xmlctx->in->current == '\0') {
        ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,"Unexpected end-of-input.");
        xmlctx_local._4_4_ = LY_EVALID;
      }
      else if ((*xmlctx->in->current == '\'') || (*xmlctx->in->current == '\"')) {
        endchar = *xmlctx->in->current;
        ly_in_skip(xmlctx->in,1);
        if (*xmlctx->in->current == '\0') {
          ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,"Unexpected end-of-input.");
          xmlctx_local._4_4_ = LY_EVALID;
        }
        else {
          xmlctx_local._4_4_ = lyxml_parse_value(xmlctx,endchar,value,value_len,ws_only,dynamic);
          if (xmlctx_local._4_4_ == LY_SUCCESS) {
            ly_in_skip(xmlctx->in,1);
            xmlctx_local._4_4_ = LY_SUCCESS;
          }
        }
      }
      else {
        plVar1 = xmlctx->ctx;
        uVar2 = LY_VCODE_INSTREXP_len(xmlctx->in->current);
        ly_vlog(plVar1,(char *)0x0,LYVE_SYNTAX,"Invalid character sequence \"%.*s\", expected %s.",
                (ulong)uVar2,xmlctx->in->current,"either single or double quotation mark");
        xmlctx_local._4_4_ = LY_EVALID;
      }
    }
  }
  else {
    plVar1 = xmlctx->ctx;
    uVar2 = LY_VCODE_INSTREXP_len(xmlctx->in->current);
    ly_vlog(plVar1,(char *)0x0,LYVE_SYNTAX,"Invalid character sequence \"%.*s\", expected %s.",
            (ulong)uVar2,xmlctx->in->current,"\'=\'");
    xmlctx_local._4_4_ = LY_EVALID;
  }
  return xmlctx_local._4_4_;
}

Assistant:

static LY_ERR
lyxml_next_attr_content(struct lyxml_ctx *xmlctx, const char **value, size_t *value_len, ly_bool *ws_only, ly_bool *dynamic)
{
    char quot;

    /* skip WS */
    ign_xmlws(xmlctx);

    /* skip '=' */
    if (xmlctx->in->current[0] == '\0') {
        LOGVAL(xmlctx->ctx, LY_VCODE_EOF);
        return LY_EVALID;
    } else if (xmlctx->in->current[0] != '=') {
        LOGVAL(xmlctx->ctx, LY_VCODE_INSTREXP, LY_VCODE_INSTREXP_len(xmlctx->in->current),
                xmlctx->in->current, "'='");
        return LY_EVALID;
    }
    move_input(xmlctx, 1);

    /* skip WS */
    ign_xmlws(xmlctx);

    /* find quotes */
    if (xmlctx->in->current[0] == '\0') {
        LOGVAL(xmlctx->ctx, LY_VCODE_EOF);
        return LY_EVALID;
    } else if ((xmlctx->in->current[0] != '\'') && (xmlctx->in->current[0] != '\"')) {
        LOGVAL(xmlctx->ctx, LY_VCODE_INSTREXP, LY_VCODE_INSTREXP_len(xmlctx->in->current),
                xmlctx->in->current, "either single or double quotation mark");
        return LY_EVALID;
    }

    /* remember quote */
    quot = xmlctx->in->current[0];
    move_input(xmlctx, 1);

    /* parse attribute value */
    LY_CHECK_RET(lyxml_parse_value(xmlctx, quot, (char **)value, value_len, ws_only, dynamic));

    /* move after ending quote (without checking for EOF) */
    ly_in_skip(xmlctx->in, 1);

    return LY_SUCCESS;
}